

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

RandomBotStrategy * __thiscall
RandomBotStrategy::operator=(RandomBotStrategy *this,RandomBotStrategy *rhs)

{
  string *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_11;
  
  (this->super_PlayerStrategy).exchangingCardType = (rhs->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (rhs->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).player = (rhs->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = (rhs->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).to = (rhs->super_PlayerStrategy).to;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>(this_00,"RANDOM",&local_11);
  operator_delete(this_00,0x20);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

RandomBotStrategy& RandomBotStrategy::operator=(const RandomBotStrategy& rhs) {
    this->exchangingCardType = rhs.exchangingCardType;
    this->armiesToPlace = rhs.armiesToPlace;
    this->player = rhs.player;
    this->from = rhs.from;
    this->to = rhs.to;
    this->strategyName = new std::string("RANDOM");
}